

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O0

QList<int> * __thiscall
QDockAreaLayoutInfo::gapIndex
          (QDockAreaLayoutInfo *this,QPoint *_pos,bool nestingEnabled,TabMode tabMode)

{
  long lVar1;
  bool bVar2;
  int index;
  DockPosition DVar3;
  QDockAreaLayoutItem *this_00;
  qsizetype qVar4;
  const_reference pQVar5;
  QList<int> *this_01;
  undefined1 in_CL;
  QDockAreaLayoutInfo *in_RDX;
  QRect *in_RSI;
  QDockAreaLayoutInfo *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  DockPosition dock_pos;
  QDockAreaLayoutItem *item;
  int i;
  int last;
  int pos;
  int item_index;
  QList<int> *result;
  QRect item_rect;
  undefined4 in_stack_ffffffffffffff38;
  parameter_type in_stack_ffffffffffffff3c;
  QRect *in_stack_ffffffffffffff40;
  QDockAreaLayoutInfo *this_02;
  int local_84;
  TabMode tabMode_00;
  uint3 in_stack_ffffffffffffff8c;
  TabMode tabMode_01;
  undefined1 nestingEnabled_00;
  undefined3 in_stack_ffffffffffffff94;
  Orientation o;
  QRect *rect;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  o = CONCAT13(in_CL,in_stack_ffffffffffffff94) & 0x1ffffff;
  tabMode_01 = (TabMode)in_stack_ffffffffffffff8c;
  ((DataPointer *)&in_RDI->sep)->d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->separatorWidgets).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->separatorWidgets).d.ptr = (QWidget **)&DAT_aaaaaaaaaaaaaaaa;
  this_02 = in_RDI;
  rect = in_RSI;
  QList<int>::QList((QList<int> *)0x56f229);
  QRect::QRect(in_stack_ffffffffffffff40);
  tabMode_00 = NoTabs;
  if ((in_RSI[5].x2.m_i & 1) == 0) {
    index = pick((Orientation)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                 (QPoint *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_84 = 0;
    while( true ) {
      this_00 = (QDockAreaLayoutItem *)(long)local_84;
      qVar4 = QList<QDockAreaLayoutItem>::size((QList<QDockAreaLayoutItem> *)(in_RSI + 4));
      if (qVar4 <= (long)this_00) break;
      pQVar5 = QList<QDockAreaLayoutItem>::at
                         ((QList<QDockAreaLayoutItem> *)in_stack_ffffffffffffff40,
                          CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      bVar2 = QDockAreaLayoutItem::skip(this_00);
      if ((!bVar2) && (index <= pQVar5->pos + pQVar5->size)) {
        if ((pQVar5->subinfo != (QDockAreaLayoutInfo *)0x0) && ((pQVar5->subinfo->tabbed & 1U) == 0)
           ) {
          gapIndex(in_RDX,(QPoint *)CONCAT44(o,in_R8D),SUB41(tabMode_01 >> 0x18,0),tabMode_00);
          QList<int>::operator=
                    ((QList<int> *)in_stack_ffffffffffffff40,
                     (QList<int> *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
          QList<int>::~QList((QList<int> *)0x56f3b7);
          QList<int>::prepend((QList<int> *)0x56f3c5,in_stack_ffffffffffffff3c);
          goto switchD_0056f4b4_default;
        }
        itemRect((QDockAreaLayoutInfo *)CONCAT44(tabMode_01,tabMode_00),index,
                 SUB41((uint)local_84 >> 0x18,0));
        break;
      }
      local_84 = local_84 + 1;
    }
    nestingEnabled_00 = (undefined1)((uint)in_R8D >> 0x18);
    bVar2 = QRect::isNull(in_stack_ffffffffffffff40);
    if (bVar2) {
      QList<int>::append((QList<int> *)0x56f44f,in_stack_ffffffffffffff3c);
      goto switchD_0056f4b4_default;
    }
  }
  else {
    tabContentRect(this_02);
    nestingEnabled_00 = (undefined1)((uint)in_R8D >> 0x18);
  }
  DVar3 = dockPosHelper(rect,(QPoint *)in_RDX,o,(bool)nestingEnabled_00,tabMode_01);
  this_01 = (QList<int> *)(ulong)DVar3;
  switch(this_01) {
  case (QList<int> *)0x0:
    if (in_RSI[2].y1.m_i == 1) {
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    }
    else {
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    }
    break;
  case (QList<int> *)0x1:
    if (in_RSI[2].y1.m_i == 1) {
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    }
    else {
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    }
    break;
  case (QList<int> *)0x2:
    if (in_RSI[2].y1.m_i == 1) {
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    }
    else {
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    }
    break;
  case (QList<int> *)0x3:
    if (in_RSI[2].y1.m_i == 1) {
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    }
    else {
      QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    }
    break;
  case (QList<int> *)0x4:
    QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
    QList<int>::operator<<(this_01,in_stack_ffffffffffffff3c);
  }
switchD_0056f4b4_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QList<int> *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QDockAreaLayoutInfo::gapIndex(const QPoint& _pos,
                        bool nestingEnabled, TabMode tabMode) const
{
    QList<int> result;
    QRect item_rect;
    int item_index = 0;

#if QT_CONFIG(tabbar)
    if (tabbed) {
        item_rect = tabContentRect();
    } else
#endif
    {
        int pos = pick(o, _pos);

        int last = -1;
        for (int i = 0; i < item_list.size(); ++i) {
            const QDockAreaLayoutItem &item = item_list.at(i);
            if (item.skip())
                continue;

            last = i;

            if (item.pos + item.size < pos)
                continue;

            if (item.subinfo != nullptr
#if QT_CONFIG(tabbar)
                && !item.subinfo->tabbed
#endif
                ) {
                result = item.subinfo->gapIndex(_pos, nestingEnabled,
                                                    tabMode);
                result.prepend(i);
                return result;
            }

            item_rect = itemRect(i);
            item_index = i;
            break;
        }

        if (item_rect.isNull()) {
            result.append(last + 1);
            return result;
        }
    }

    Q_ASSERT(!item_rect.isNull());

    QInternal::DockPosition dock_pos
        = dockPosHelper(item_rect, _pos, o, nestingEnabled, tabMode);

    switch (dock_pos) {
        case QInternal::LeftDock:
            if (o == Qt::Horizontal)
                result << item_index;
            else
                result << item_index << 0; // this subinfo doesn't exist yet, but insertGap()
                                           // handles this by inserting it
            break;
        case QInternal::RightDock:
            if (o == Qt::Horizontal)
                result << item_index + 1;
            else
                result << item_index << 1;
            break;
        case QInternal::TopDock:
            if (o == Qt::Horizontal)
                result << item_index << 0;
            else
                result << item_index;
            break;
        case QInternal::BottomDock:
            if (o == Qt::Horizontal)
                result << item_index << 1;
            else
                result << item_index + 1;
            break;
        case  QInternal::DockCount:
            result << (-item_index - 1) << 0;   // negative item_index means "on top of"
                                                // -item_index - 1, insertGap()
                                                // will insert a tabbed subinfo
            break;
        default:
            break;
    }

    return result;
}